

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gabby.cc
# Opt level: O1

void __thiscall GB::ld_a_mnn(GB *this)

{
  u16 uVar1;
  long lVar2;
  u8 uVar3;
  
  lVar2 = (this->s).op_tick;
  if (lVar2 == 0x1e) {
    uVar3 = Read(this,(this->s).field_6.wz);
    (this->s).field_2.field_0.a = uVar3;
    (this->s).op_tick = -2;
  }
  else if (lVar2 == 0x16) {
    uVar1 = (this->s).pc;
    (this->s).pc = uVar1 + 1;
    uVar3 = Read(this,uVar1);
    (this->s).field_6.field_0.w = uVar3;
  }
  else if (lVar2 == 0xe) {
    uVar1 = (this->s).pc;
    (this->s).pc = uVar1 + 1;
    uVar3 = Read(this,uVar1);
    (this->s).field_6.field_0.z = uVar3;
  }
  return;
}

Assistant:

void GB::ld_a_mnn() {
  switch (s.op_tick) {
    case 14: s.z = read_n(); break;
    case 22: s.w = read_n(); break;
    case 30: s.a = Read(s.wz); op_done(); break;
  }
}